

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::emit_dqt(jpeg_encoder *this)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  int j;
  long lVar3;
  int32 (*paiVar4) [64];
  long lVar5;
  bool bVar6;
  undefined8 uStack_38;
  int iVar2;
  
  paiVar4 = this->m_quantization_tables;
  lVar5 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    emit_marker(this,0xdb);
    emit_word(this,0x43);
    uStack_38._0_7_ = CONCAT16((char)lVar5,(undefined6)uStack_38);
    if (this->m_all_stream_writes_succeeded == true) {
      iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
      uVar1 = (undefined1)iVar2;
    }
    else {
      uVar1 = false;
    }
    this->m_all_stream_writes_succeeded = (bool)uVar1;
    lVar3 = 0;
    do {
      uStack_38 = CONCAT17((char)(*paiVar4)[lVar3],(undefined7)uStack_38);
      if (this->m_all_stream_writes_succeeded == true) {
        iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
        uVar1 = (undefined1)iVar2;
      }
      else {
        uVar1 = false;
      }
      this->m_all_stream_writes_succeeded = (bool)uVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    if (this->m_num_components != '\x03') break;
    paiVar4 = paiVar4 + 1;
    bVar6 = lVar5 != 0;
    lVar5 = lVar5 + 1;
    if (bVar6) {
      return;
    }
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dqt()
{
  for (int i = 0; i < ((m_num_components == 3) ? 2 : 1); i++)
  {
    emit_marker(M_DQT);
    emit_word(64 + 1 + 2);
    emit_byte(static_cast<uint8>(i));
    for (int j = 0; j < 64; j++)
      emit_byte(static_cast<uint8>(m_quantization_tables[i][j]));
  }
}